

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SpecifyBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SpecifyBlockSymbol,slang::ast::Compilation&,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1)

{
  SpecifyBlockSymbol *pSVar1;
  size_t in_RDX;
  Compilation *in_RSI;
  SpecifyBlockSymbol *in_RDI;
  SourceLocation unaff_retaddr;
  
  pSVar1 = (SpecifyBlockSymbol *)allocate((BumpAllocator *)in_RDI,(size_t)in_RSI,in_RDX);
  slang::ast::SpecifyBlockSymbol::SpecifyBlockSymbol(in_RDI,in_RSI,unaff_retaddr);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }